

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *cp)

{
  atomic_int *paVar1;
  void *pvVar2;
  TPZReference *pTVar3;
  
  TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>,vtt + 1,DestMesh,
             &cp->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>);
  pvVar2 = *vtt;
  *(void **)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).super_TPZGeoEl = pvVar2;
  *(void **)((long)(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).fGeo.
                   super_TPZNodeRep<10,_pztopology::TPZTetrahedron>.fNodeIndexes +
            *(long *)((long)pvVar2 + -0x60) + -0x48) = vtt[5];
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fNAlloc = 0;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  pTVar3 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  TPZVec<long>::operator=(&this->fSubEl,&cp->fSubEl);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}